

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CInstIterNext(CInstIter *pIter)

{
  int iVar1;
  int iVar2;
  int io;
  int ic;
  int ip;
  int local_3c;
  int local_38;
  int local_34;
  
  pIter->iStart = -1;
  pIter->iEnd = -1;
  iVar2 = pIter->iInst;
  if (iVar2 < pIter->nInst) {
    do {
      iVar1 = (*pIter->pApi->xInst)(pIter->pFts,iVar2,&local_34,&local_38,&local_3c);
      iVar2 = local_3c;
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_38 == pIter->iCol) {
        iVar1 = (*pIter->pApi->xPhraseSize)(pIter->pFts,local_34);
        iVar2 = iVar1 + iVar2 + -1;
        if (pIter->iStart < 0) {
          pIter->iStart = local_3c;
        }
        else {
          if (pIter->iEnd < local_3c) {
            return 0;
          }
          if (iVar2 <= pIter->iEnd) goto LAB_001d727d;
        }
        pIter->iEnd = iVar2;
      }
LAB_001d727d:
      iVar2 = pIter->iInst + 1;
      pIter->iInst = iVar2;
    } while (iVar2 < pIter->nInst);
  }
  return 0;
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}